

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O2

IGUISpriteBank * __thiscall
irr::gui::CGUIEnvironment::getSpriteBank(CGUIEnvironment *this,path *filename)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  IGUISpriteBank *pIVar4;
  double __x;
  SSpriteBank b;
  SSpriteBank local_68;
  
  local_68.NamedPath.Path.str._M_dataplus._M_p = (pointer)&local_68.NamedPath.Path.str.field_2;
  local_68.NamedPath.Path.str._M_string_length = 0;
  local_68.NamedPath.Path.str.field_2._M_local_buf[0] = '\0';
  local_68.NamedPath.InternalName.str._M_dataplus._M_p =
       (pointer)&local_68.NamedPath.InternalName.str.field_2;
  local_68.NamedPath.InternalName.str._M_string_length = 0;
  local_68.NamedPath.InternalName.str.field_2._M_local_buf[0] = '\0';
  irr::io::SNamedPath::setPath(&local_68.NamedPath,filename);
  uVar2 = core::array<irr::gui::CGUIEnvironment::SSpriteBank>::binary_search(&this->Banks,&local_68)
  ;
  if (uVar2 == 0xffffffff) {
    iVar3 = (*this->FileSystem->_vptr_IFileSystem[0x1b])(this->FileSystem,&local_68);
    if ((char)iVar3 == '\0') {
      bVar1 = core::string<char>::operator!=(filename,(string<char> *)DefaultFontName);
      if (bVar1) {
        pIVar4 = (IGUISpriteBank *)0x0;
        os::Printer::log(__x);
        goto LAB_0022cfd0;
      }
    }
    pIVar4 = (IGUISpriteBank *)0x0;
  }
  else {
    pIVar4 = (this->Banks).m_data.
             super__Vector_base<irr::gui::CGUIEnvironment::SSpriteBank,_std::allocator<irr::gui::CGUIEnvironment::SSpriteBank>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar2].Bank;
  }
LAB_0022cfd0:
  irr::io::SNamedPath::~SNamedPath(&local_68.NamedPath);
  return pIVar4;
}

Assistant:

IGUISpriteBank *CGUIEnvironment::getSpriteBank(const io::path &filename)
{
	// search for the file name

	SSpriteBank b;
	b.NamedPath.setPath(filename);

	s32 index = Banks.binary_search(b);
	if (index != -1)
		return Banks[index].Bank;

	// we don't have this sprite bank, we should load it
	if (!FileSystem->existFile(b.NamedPath.getPath())) {
		if (filename != DefaultFontName) {
			os::Printer::log("Could not load sprite bank because the file does not exist", b.NamedPath.getPath(), ELL_DEBUG);
		}
		return 0;
	}

	// todo: load it!

	return 0;
}